

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_tas(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGTemp *pTVar1;
  TCGv_i32 pTVar2;
  int reg0;
  int mode;
  uint mode_00;
  uintptr_t o;
  TCGv_i32 ret;
  TCGv_i32 addr;
  
  s_00 = s->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  mode_00 = insn >> 3 & 7;
  pTVar2 = gen_ea_mode(env,s,mode_00,insn & 7,0,s_00->NULL_QREG,&addr,EA_LOADS,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar2 != s_00->NULL_QREG) {
    ret = (TCGv_i32)((long)pTVar1 - (long)s_00);
    tcg_gen_ext8s_i32_m68k(s->uc->tcg_ctx,QREG_CC_N,pTVar2);
    set_cc_op(s,CC_OP_LOGIC);
    tcg_gen_ori_i32_m68k(s_00,ret,pTVar2,0x80);
    pTVar2 = gen_ea_mode(env,s,mode_00,insn & 7,0,ret,&addr,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 != s_00->NULL_QREG) {
      tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
      return;
    }
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(tas)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv dest;
    TCGv src1;
    TCGv addr;

    dest = tcg_temp_new(tcg_ctx);
    SRC_EA(env, src1, OS_BYTE, 1, &addr);
    gen_logic_cc(s, src1, OS_BYTE);
    tcg_gen_ori_i32(tcg_ctx, dest, src1, 0x80);
    DEST_EA(env, insn, OS_BYTE, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}